

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)303>(Result *__return_storage_ptr__,Model *format)

{
  ValidationPolicy *this;
  bool bVar1;
  int32_t modelVersion;
  ModelDescription *pMVar2;
  NeuralNetworkRegressor *nn;
  undefined1 local_88 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputBlobNames;
  undefined1 local_48 [8];
  Result r;
  ValidationPolicy validationPolicy;
  Model *format_local;
  
  this = (ValidationPolicy *)((long)&r.m_message.field_2 + 0xc);
  ValidationPolicy::ValidationPolicy(this,MLModelType_neuralNetworkRegressor);
  pMVar2 = Specification::Model::description(format);
  modelVersion = Specification::Model::specificationversion(format);
  validateRegressorInterface((Result *)local_48,pMVar2,modelVersion,this);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_88);
    pMVar2 = Specification::Model::description(format);
    nn = Specification::Model::neuralnetworkregressor(format);
    bVar1 = Specification::Model::isupdatable(format);
    validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkRegressor>
              (__return_storage_ptr__,pMVar2,nn,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88,bVar1,(ValidationPolicy *)((long)&r.m_message.field_2 + 0xc));
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88);
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_neuralNetworkRegressor>(const Specification::Model& format) {
        auto validationPolicy = ValidationPolicy(MLModelType_neuralNetworkRegressor);

        // must have regressor parameters
        Result r = validateRegressorInterface(format.description(), format.specificationversion(), validationPolicy);
        if (!r.good()) {
            return r;
        }

        std::set<std::string> outputBlobNames;
        return validateNeuralNetworkTopLevel(format.description(), format.neuralnetworkregressor(), outputBlobNames, format.isupdatable(), validationPolicy);
    }